

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayInitData
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          ArrayInitData *curr)

{
  Field field;
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  size_type sVar6;
  Literal *this_00;
  Name NVar7;
  undefined1 local_1b8 [8];
  Flow ref;
  Flow index;
  Flow offset;
  Flow size;
  anon_union_16_6_1532cd5a_for_Literal_0 local_90;
  Type TStack_78;
  Field elem;
  long local_50;
  shared_ptr<wasm::GCData> data;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_1b8,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x20));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&ref.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x28));
    if (index.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&index.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x30));
      if (offset.breakTo.super_IString.str._M_len == 0) {
        ExpressionRunner<wasm::ModuleRunner>::visit
                  ((Flow *)&offset.breakTo.super_IString.str._M_str,
                   &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x38));
        if (size.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)local_1b8);
          ::wasm::Literal::getGCData();
          if (local_50 == 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"null ref");
          }
          Flow::getSingleValue((Flow *)&ref.breakTo.super_IString.str._M_str);
          lVar2 = ::wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)&index.breakTo.super_IString.str._M_str);
          lVar3 = ::wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)&offset.breakTo.super_IString.str._M_str);
          lVar4 = ::wasm::Literal::getUnsigned();
          lVar5 = *(long *)(local_50 + 0x30) - *(long *)(local_50 + 0x28);
          if ((ulong)(lVar5 / 0x18 + *(long *)(local_50 + 8)) < (ulong)(lVar2 + lVar4)) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds array access in array.init",lVar5 % 0x18);
          }
          NVar7.super_IString.str._M_str = *(char **)(curr + 0x10);
          NVar7.super_IString.str._M_len =
               (size_t)(this->super_ExpressionRunner<wasm::ModuleRunner>).module;
          data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::wasm::Module::getDataSegment(NVar7)
          ;
          Type::getHeapType((Type *)(*(long *)(curr + 0x20) + 8));
          ::wasm::HeapType::getArray();
          TStack_78.id = local_90.i64;
          elem.type.id = (uintptr_t)
                         local_90.gcData.
                         super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi;
          uVar1 = ::wasm::Field::getByteSize();
          if ((ulong)((long)data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[4]._vptr__Sp_counted_base -
                     *(long *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi[3]._M_use_count) < lVar4 * (ulong)uVar1 + lVar3) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in array.init_data");
          }
          if (lVar3 + lVar4 != 0) {
            sVar6 = std::
                    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::count(&(this->droppedDataSegments)._M_h,(key_type *)(curr + 0x10));
            if (sVar6 != 0) {
              (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                        (this,"out of bounds segment access in array.init_data");
            }
          }
          elem._8_8_ = -lVar4;
          lVar5 = lVar2 * 0x18 + -0x18;
          for (lVar4 = 0; elem._8_8_ != lVar4; lVar4 = lVar4 + -1) {
            field.packedType = (undefined4)elem.type.id;
            field.mutable_ = elem.type.id._4_4_;
            field.type.id = TStack_78.id;
            ExpressionRunner<wasm::ModuleRunner>::makeFromMemory
                      ((Literal *)&local_90.func,&this->super_ExpressionRunner<wasm::ModuleRunner>,
                       (void *)(*(long *)&data.
                                          super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi[3]._M_use_count + lVar3),field);
            this_00 = (Literal *)(local_50 + 0x10);
            if (lVar2 != lVar4) {
              this_00 = (Literal *)(*(long *)(local_50 + 0x28) + lVar5);
            }
            ::wasm::Literal::operator=(this_00,(Literal *)&local_90.func);
            ::wasm::Literal::~Literal((Literal *)&local_90.func);
            lVar3 = lVar3 + (ulong)uVar1;
            lVar5 = lVar5 + 0x18;
          }
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
        }
        else {
          Flow::Flow(__return_storage_ptr__,(Flow *)&offset.breakTo.super_IString.str._M_str);
        }
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&offset.breakTo.super_IString.str._M_str);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&index.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&index.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ref.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_1b8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_1b8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayInitData(ArrayInitData* curr) {
    NOTE_ENTER("ArrayInit");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    size_t indexVal = index.getSingleValue().getUnsigned();
    size_t offsetVal = offset.getSingleValue().getUnsigned();
    size_t sizeVal = size.getSingleValue().getUnsigned();

    size_t arraySize = data->values.size();
    if ((uint64_t)indexVal + sizeVal > arraySize) {
      trap("out of bounds array access in array.init");
    }

    Module& wasm = *self()->getModule();

    auto* seg = wasm.getDataSegment(curr->segment);
    auto elem = curr->ref->type.getHeapType().getArray().element;
    size_t elemSize = elem.getByteSize();
    uint64_t readSize = (uint64_t)sizeVal * elemSize;
    if (offsetVal + readSize > seg->data.size()) {
      trap("out of bounds segment access in array.init_data");
    }
    if (offsetVal + sizeVal > 0 && droppedDataSegments.count(curr->segment)) {
      trap("out of bounds segment access in array.init_data");
    }
    for (size_t i = 0; i < sizeVal; i++) {
      void* addr = (void*)&seg->data[offsetVal + i * elemSize];
      data->values[indexVal + i] = this->makeFromMemory(addr, elem);
    }
    return {};
  }